

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O0

int Vec_StrGets(char *pBuffer,int nBufferSize,Vec_Str_t *vStr,int *pPos)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pEnd;
  char *pBeg;
  char *pCur;
  int *pPos_local;
  Vec_Str_t *vStr_local;
  char *pcStack_18;
  int nBufferSize_local;
  char *pBuffer_local;
  
  pcVar3 = Vec_StrArray(vStr);
  pcVar3 = pcVar3 + *pPos;
  pcVar4 = Vec_StrArray(vStr);
  iVar2 = Vec_StrSize(vStr);
  pcVar4 = pcVar4 + iVar2;
  if (nBufferSize < 2) {
    __assert_fail("nBufferSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                  ,0x141,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
  }
  if (pcVar3 == pcVar4) {
    *pBuffer = '\0';
  }
  else {
    pBeg = pcVar3;
    pcStack_18 = pBuffer;
    if (pcVar4 <= pcVar3) {
      __assert_fail("pBeg < pEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                    ,0x147,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
    }
    for (; pBeg < pcVar4; pBeg = pBeg + 1) {
      pcVar5 = pcStack_18 + 1;
      *pcStack_18 = *pBeg;
      iVar2 = (int)pBeg;
      iVar1 = (int)pcVar3;
      if (*pBeg == '\0') {
        *pPos = *pPos + (iVar2 - iVar1);
        return 0;
      }
      if (*pBeg == '\n') {
        *pPos = *pPos + (iVar2 - iVar1) + 1;
        *pcVar5 = '\0';
        return 1;
      }
      if ((long)pBeg - (long)pcVar3 == (long)(nBufferSize + -1)) {
        *pPos = *pPos + (iVar2 - iVar1) + 1;
        *pcVar5 = '\0';
        return 1;
      }
      pcStack_18 = pcVar5;
    }
  }
  return 0;
}

Assistant:

int Vec_StrGets( char * pBuffer, int nBufferSize, Vec_Str_t * vStr, int * pPos )
{
    char * pCur;
    char * pBeg = Vec_StrArray(vStr) + *pPos;
    char * pEnd = Vec_StrArray(vStr) + Vec_StrSize(vStr);
    assert( nBufferSize > 1 );
    if ( pBeg == pEnd )
    {
        *pBuffer = 0;
        return 0;
    }
    assert( pBeg < pEnd );
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    {
        *pBuffer++ = *pCur;
        if ( *pCur == 0 )
        {
            *pPos += pCur - pBeg;
            return 0;
        }
        if ( *pCur == '\n' )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
        if ( pCur - pBeg == nBufferSize-1 )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
    }
    return 0;
}